

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshTopology::GetTopFaceVertices(ON_MeshTopology *this,int fi,int *topvi)

{
  int iVar1;
  ON_MeshFace *pOVar2;
  int *piVar3;
  int *fvi;
  int *topvi_local;
  int fi_local;
  ON_MeshTopology *this_local;
  
  if (-1 < fi) {
    iVar1 = ON_SimpleArray<ON_MeshFace>::Count(&this->m_mesh->m_F);
    if (fi < iVar1) {
      pOVar2 = ON_SimpleArray<ON_MeshFace>::operator[](&this->m_mesh->m_F,fi);
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_topv_map,pOVar2->vi[0]);
      *topvi = *piVar3;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_topv_map,pOVar2->vi[1]);
      topvi[1] = *piVar3;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_topv_map,pOVar2->vi[2]);
      topvi[2] = *piVar3;
      piVar3 = ON_SimpleArray<int>::operator[](&this->m_topv_map,pOVar2->vi[3]);
      topvi[3] = *piVar3;
    }
  }
  return true;
}

Assistant:

bool ON_MeshTopology::GetTopFaceVertices( int fi, int topvi[4] ) const
{
  if ( fi >= 0 && fi < m_mesh->m_F.Count() ) {
    const int* fvi = m_mesh->m_F[fi].vi;
    topvi[0] = m_topv_map[fvi[0]];
    topvi[1] = m_topv_map[fvi[1]];
    topvi[2] = m_topv_map[fvi[2]];
    topvi[3] = m_topv_map[fvi[3]];
  }
  return true;
}